

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImGuiWindow *pIVar1;
  ImGuiViewportP *pIVar2;
  ImVec2 mx;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ImVec2 pos;
  ImVec2 local_8;
  
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar1 = GImGui->NavWindow, pIVar1 != (ImGuiWindow *)0x0)) {
    auVar5._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar3 = pIVar1->NavRectRel[GImGui->NavLayer].Min;
    IVar4 = pIVar1->NavRectRel[GImGui->NavLayer].Max;
    fVar8 = IVar4.y;
    fVar7 = IVar3.x;
    auVar5._4_4_ = (GImGui->Style).FramePadding.y;
    auVar5._8_8_ = 0;
    auVar6._4_4_ = fVar8 - IVar3.y;
    auVar6._0_4_ = IVar4.x - fVar7;
    auVar6._8_8_ = 0;
    auVar6 = minps(auVar5,auVar6);
    local_8.x = (pIVar1->Pos).x + fVar7 + auVar6._0_4_;
    local_8.y = (pIVar1->Pos).y + (fVar8 - auVar6._4_4_);
    pIVar2 = *(GImGui->Viewports).Data;
    IVar3 = (pIVar2->super_ImGuiViewport).Pos;
    IVar4 = (pIVar2->super_ImGuiViewport).Size;
    mx.x = IVar4.x + IVar3.x;
    mx.y = IVar4.y + IVar3.y;
    IVar3 = ImClamp(&local_8,&(pIVar2->super_ImGuiViewport).Pos,mx);
    IVar4.x = (float)(int)IVar3.x;
    IVar4.y = (float)(int)IVar3.y;
    return IVar4;
  }
  if ((-256000.0 <= (GImGui->IO).MousePos.x) && (-256000.0 <= (GImGui->IO).MousePos.y)) {
    return (GImGui->IO).MousePos;
  }
  return GImGui->LastValidMousePos;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}